

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_clone.c
# Opt level: O0

void clone_free(t_clone *x)

{
  int local_18;
  int local_14;
  int voicetovis;
  int i;
  t_clone *x_local;
  
  if (x->x_vec != (t_copy *)0x0) {
    local_18 = -1;
    if ((pd_maininstance.pd_gui)->i_reloadingabstraction != (_glist *)0x0) {
      for (local_14 = 0; local_14 < x->x_n; local_14 = local_14 + 1) {
        if (x->x_vec[local_14].c_gl == (pd_maininstance.pd_gui)->i_reloadingabstraction) {
          local_18 = local_14;
        }
      }
    }
    for (local_14 = 0; local_14 < x->x_n; local_14 = local_14 + 1) {
      canvas_closebang(x->x_vec[local_14].c_gl);
      pd_free((t_pd *)x->x_vec[local_14].c_gl);
      freebytes(x->x_outvec[local_14],(long)x->x_nout * 0x18);
    }
    freebytes(x->x_vec,(long)x->x_n << 4);
    freebytes(x->x_argv,(long)x->x_argc << 4);
    freebytes(x->x_invec,(long)x->x_nin * 0x18);
    freebytes(x->x_outvec,(long)x->x_n << 3);
    clone_voicetovis = local_18;
  }
  return;
}

Assistant:

static void clone_free(t_clone *x)
{
    if (x->x_vec)
    {
        int i, voicetovis = -1;
        if (THISGUI->i_reloadingabstraction)
        {
            for (i = 0; i < x->x_n; i++)
                if (x->x_vec[i].c_gl == THISGUI->i_reloadingabstraction)
                    voicetovis = i;
        }
        for (i = 0; i < x->x_n; i++)
        {
            canvas_closebang(x->x_vec[i].c_gl);
            pd_free(&x->x_vec[i].c_gl->gl_pd);
            t_freebytes(x->x_outvec[i],
                x->x_nout * sizeof(*x->x_outvec[i]));
        }
        t_freebytes(x->x_vec, x->x_n * sizeof(*x->x_vec));
        t_freebytes(x->x_argv, x->x_argc * sizeof(*x->x_argv));
        t_freebytes(x->x_invec, x->x_nin * sizeof(*x->x_invec));
        t_freebytes(x->x_outvec, x->x_n * sizeof(*x->x_outvec));
        clone_voicetovis = voicetovis;
    }
}